

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O2

ostream * despot::operator<<(ostream *os,HierarchyCPT *hcpt)

{
  ostream *poVar1;
  long lVar2;
  int i;
  ulong uVar3;
  
  poVar1 = std::operator<<(os,"Root variable: ");
  poVar1 = std::operator<<(poVar1,(string *)
                                  &(*(hcpt->super_CPT).super_Function.parents_.
                                     super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->name_);
  std::endl<char,std::char_traits<char>>(poVar1);
  lVar2 = 0;
  for (uVar3 = 0;
      uVar3 < (ulong)((long)(hcpt->cpts_).
                            super__Vector_base<despot::TabularCPT_*,_std::allocator<despot::TabularCPT_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(hcpt->cpts_).
                            super__Vector_base<despot::TabularCPT_*,_std::allocator<despot::TabularCPT_*>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3); uVar3 = uVar3 + 1) {
    poVar1 = std::operator<<(os,(string *)
                                &(*(hcpt->super_CPT).super_Function.parents_.
                                   super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->name_);
    poVar1 = std::operator<<(poVar1," = ");
    poVar1 = std::operator<<(poVar1,(string *)
                                    (*(long *)&((*(hcpt->super_CPT).super_Function.parents_.
                                                  super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                               super_Variable).values_.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data + lVar2));
    poVar1 = std::operator<<(poVar1," ");
    operator<<(poVar1,(Function *)
                      (hcpt->cpts_).
                      super__Vector_base<despot::TabularCPT_*,_std::allocator<despot::TabularCPT_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar3]);
    std::endl<char,std::char_traits<char>>(poVar1);
    lVar2 = lVar2 + 0x20;
  }
  return os;
}

Assistant:

ostream& operator<<(std::ostream& os, const HierarchyCPT& hcpt) {
	os << "Root variable: " << hcpt.parents_[0]->name() << endl;
	for (int i = 0; i < hcpt.cpts_.size(); i++)
		os << hcpt.parents_[0]->name() << " = " << hcpt.parents_[0]->GetValue(i)
			<< " " << *(hcpt.cpts_[i]) << endl;
	return os;
}